

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateGetRootAsAccessors
          (KotlinKMPGenerator *this,string *struct_name,CodeWriter *writer,IDLOptions *options)

{
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  string local_58;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"gr_name",(allocator<char> *)&local_58);
  CodeWriter::SetValue(writer,&local_78,struct_name);
  std::__cxx11::string::~string((string *)&local_78);
  GenerateJvmStaticAnnotation(writer,options->gen_jvmstatic);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"asRoot",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"buffer: ReadWriteBuffer",&local_7a);
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1338:24)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1338:24)>
             ::_M_manager;
  local_38._M_unused._M_object = writer;
  GenerateFunOneLine(writer,&local_78,&local_58,struct_name,(function<void_()> *)&local_38,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  GenerateJvmStaticAnnotation(writer,options->gen_jvmstatic);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"asRoot",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"buffer: ReadWriteBuffer, obj: {{gr_name}}",&local_7a);
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1345:22)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1345:22)>
             ::_M_manager;
  local_38._M_unused._M_object = writer;
  GenerateFunOneLine(writer,&local_78,&local_58,struct_name,(function<void_()> *)&local_38,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void GenerateGetRootAsAccessors(const std::string &struct_name,
                                  CodeWriter &writer,
                                  IDLOptions options) const {
    // Generate a special accessor for the table that when used as the root
    // ex: fun getRootAsMonster(buffer: ByteBuffer): Monster {...}
    writer.SetValue("gr_name", struct_name);

    // create convenience method that doesn't require an existing object
    GenerateJvmStaticAnnotation(writer, options.gen_jvmstatic);
    GenerateFunOneLine(writer, "asRoot", "buffer: ReadWriteBuffer", struct_name,
                       [&]() { writer += "asRoot(buffer, {{gr_name}}())"; });

    // create method that allows object reuse
    // ex: fun Monster getRootAsMonster(buffer: ByteBuffer, obj: Monster) {...}
    GenerateJvmStaticAnnotation(writer, options.gen_jvmstatic);
    GenerateFunOneLine(
        writer, "asRoot", "buffer: ReadWriteBuffer, obj: {{gr_name}}",
        struct_name, [&]() {
          writer +=
              "obj.init(buffer.getInt(buffer.limit) + buffer.limit, buffer)";
        });
  }